

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

Level * __thiscall
hta::Metric::restore_level(Level *__return_storage_ptr__,Metric *this,Duration interval)

{
  TimeAggregate ta_00;
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar4;
  reference pTVar5;
  base local_1b0;
  duration local_1a8;
  TimeAggregate local_1a0;
  reference local_168;
  TimeAggregate *ta;
  iterator __end2;
  iterator __begin2;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__range2;
  duration local_138;
  duration local_130;
  undefined1 local_128 [8];
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> data_1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_100;
  Duration smaller_interval;
  TimeValue *tv;
  iterator __end3;
  iterator __begin3;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__range3;
  duration local_a8;
  rep local_a0;
  undefined1 local_98 [8];
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> data;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_78 [7];
  base local_40;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_38;
  Metric *local_30;
  undefined4 local_24;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tStack_20;
  Scope scope_begin;
  TimePoint time_closed;
  Metric *this_local;
  Duration interval_local;
  
  time_closed.
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)this;
  this_local = (Metric *)interval.__r;
  Level::Level(__return_storage_ptr__);
  pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
           operator->(&this->storage_metric_);
  iVar2 = (*pMVar3->_vptr_Metric[10])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    Clock::time_point::time_point((time_point *)&stack0xffffffffffffffe0);
    local_24 = 3;
    pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
             operator->(&this->storage_metric_);
    local_30 = this_local;
    iVar2 = (*pMVar3->_vptr_Metric[0xb])(pMVar3,this_local);
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
               operator->(&this->storage_metric_);
      data.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)this_local;
      (*pMVar3->_vptr_Metric[9])(local_78,pMVar3,this_local);
      local_40.__d.__r =
           (duration)
           std::chrono::operator+
                     (local_78,(duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local);
      Clock::time_point::time_point((time_point *)&local_38,&local_40);
      tStack_20.__d.__r = local_38.__d.__r;
      local_24 = 1;
      (__return_storage_ptr__->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (rep)local_38.__d.__r;
    }
    bVar1 = std::chrono::operator==
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local,
                       &this->interval_min_);
    if (bVar1) {
      pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
               operator->(&this->storage_metric_);
      local_a0 = (rep)tStack_20.__d.__r;
      memset(&local_a8,0,8);
      Clock::time_point::time_point((time_point *)&local_a8);
      (*pMVar3->_vptr_Metric[5])(local_98,pMVar3,local_a0,local_a8.__r,CONCAT44(3,local_24));
      bVar1 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::empty
                        ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_98);
      if (!bVar1) {
        bVar1 = Clock::time_point::operator_cast_to_bool(&__return_storage_ptr__->time_current);
        if (!bVar1) {
          pvVar4 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::operator[]
                             ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_98,0)
          ;
          (__return_storage_ptr__->time_current).
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r = (pvVar4->time).
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r;
        }
        __end3 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::begin
                           ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_98);
        tv = (TimeValue *)
             std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::end
                       ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_98);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                                           *)&tv), bVar1) {
          pTVar5 = __gnu_cxx::
                   __normal_iterator<hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                   ::operator*(&__end3);
          smaller_interval.__r =
               (pTVar5->time).
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
          Level::advance(__return_storage_ptr__,*pTVar5);
          __gnu_cxx::
          __normal_iterator<hta::TimeValue_*,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
          ::operator++(&__end3);
        }
      }
      std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~vector
                ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_98);
    }
    else {
      data_1.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(this->interval_factor_).factor_;
      local_100.__r =
           (rep)operator/((Duration)this_local,
                          (IntervalFactor)
                          data_1.
                          super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pMVar3 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
               operator->(&this->storage_metric_);
      local_130 = tStack_20.__d.__r;
      memset(&local_138,0,8);
      Clock::time_point::time_point((time_point *)&local_138);
      (*pMVar3->_vptr_Metric[6])
                (local_128,pMVar3,local_130.__r,local_138.__r,local_100.__r,CONCAT44(3,local_24));
      __end2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::begin
                         ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                          local_128);
      ta = (TimeAggregate *)
           std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::end
                     ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_128);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                                         *)&ta), bVar1) {
        local_168 = __gnu_cxx::
                    __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                    ::operator*(&__end2);
        local_1b0.__d.__r =
             (duration)
             std::chrono::operator+
                       ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)local_168,&local_100);
        Clock::time_point::time_point((time_point *)&local_1a8,&local_1b0);
        TimeAggregate::TimeAggregate(&local_1a0,(TimePoint)local_1a8.__r,local_168->aggregate);
        ta_00.aggregate.minimum = local_1a0.aggregate.minimum;
        ta_00.time.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = local_1a0.time.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r;
        ta_00.aggregate.maximum = local_1a0.aggregate.maximum;
        ta_00.aggregate.sum = local_1a0.aggregate.sum;
        ta_00.aggregate.count = local_1a0.aggregate.count;
        ta_00.aggregate.integral = local_1a0.aggregate.integral;
        ta_00.aggregate.active_time.__r = local_1a0.aggregate.active_time.__r;
        Level::advance(__return_storage_ptr__,ta_00);
        __gnu_cxx::
        __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
        ::operator++(&__end2);
      }
      std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~vector
                ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Level Metric::restore_level(Duration interval)
{
    Level level;
    if (storage_metric_->size() == 0)
    {
        // No need to restore anything.
        return level;
    }

    // How much did we already store here?
    TimePoint time_closed;
    Scope scope_begin = Scope::infinity;
    if (storage_metric_->size(interval))
    {
        time_closed = storage_metric_->last(interval).time + interval;
        scope_begin = Scope ::closed;
        level.time_current = time_closed;
    }

    if (interval == interval_min_)
    {
        auto data =
            storage_metric_->get(time_closed, {}, IntervalScope{ scope_begin, Scope::infinity });
        if (!data.empty())
        {
            if (!level.time_current)
            {
                level.time_current = data[0].time;
            }
            for (auto& tv : data)
            {
                level.advance(tv);
            }
        }
    }
    else
    {
        auto smaller_interval = interval / interval_factor_;
        auto data = storage_metric_->get(time_closed, {}, smaller_interval,
                                         IntervalScope{ scope_begin, Scope::infinity });
        for (auto& ta : data)
        {
            level.advance({ ta.time + smaller_interval, ta.aggregate });
        }
    }
    return level;
}